

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_array_suite.cpp
# Opt level: O3

void api_suite::api_ctor_move_assign(void)

{
  undefined8 local_58;
  undefined4 local_4c;
  undefined4 local_48 [4];
  undefined4 *local_38;
  undefined8 local_30;
  undefined8 local_28;
  
  local_38 = local_48;
  local_28 = 5;
  local_30 = 1;
  local_48[0] = 0xb;
  local_58 = 1;
  local_4c = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("copy.size()","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_array_suite.cpp"
             ,0x40,"void api_suite::api_ctor_move_assign()",&local_58,&local_4c);
  local_58 = 4;
  local_4c = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("copy.capacity()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_array_suite.cpp"
             ,0x41,"void api_suite::api_ctor_move_assign()",&local_58,&local_4c);
  return;
}

Assistant:

void api_ctor_move_assign()
{
    circular_array<int, 4> data;
    data.push_back(11);
    circular_array<int, 4> copy;
    copy = std::move(data);
    BOOST_TEST_EQ(copy.size(), 1);
    BOOST_TEST_EQ(copy.capacity(), 4);
}